

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob.cpp
# Opt level: O1

int __thiscall glob::glob::open(glob *this,char *__file,int __oflag,...)

{
  long lVar1;
  DIR *pDVar2;
  char *extraout_RAX;
  char *pcVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  dir_and_file;
  char *local_a8;
  undefined8 *local_a0;
  char local_98 [8];
  undefined8 uStack_90;
  undefined8 uStack_88;
  char *local_80;
  undefined8 local_78;
  char local_70 [8];
  undefined8 uStack_68;
  undefined8 *local_60;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 *local_40 [2];
  undefined8 local_30;
  undefined8 uStack_28;
  
  lVar1 = std::__cxx11::string::find_last_of(__file,0x2f43a8,0xffffffffffffffff);
  if (lVar1 == -1) {
    local_a8 = ".";
    local_a0 = &uStack_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,*(long *)__file,*(long *)(__file + 8) + *(long *)__file);
    std::__cxx11::string::string((string *)&local_80,local_a8,(allocator *)local_40);
    local_60 = &local_50;
    if (local_a0 == &uStack_90) {
      uStack_48 = uStack_88;
    }
    else {
      local_60 = local_a0;
    }
  }
  else {
    local_a8 = local_98;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_a8,*(long *)__file,*(long *)__file + lVar1);
    local_40[0] = &local_30;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)local_40,*(long *)__file + lVar1 + 1,
               *(long *)__file + *(long *)(__file + 8));
    local_80 = local_70;
    if (local_a8 == local_98) {
      uStack_68 = uStack_90;
    }
    else {
      local_80 = local_a8;
    }
    local_60 = &local_50;
    local_78 = local_a0;
    local_a0 = (undefined8 *)0x0;
    local_98[0] = '\0';
    if (local_40[0] == &local_30) {
      uStack_48 = uStack_28;
      local_a8 = local_98;
    }
    else {
      local_60 = local_40[0];
      local_a8 = local_98;
    }
  }
  pDVar2 = opendir(local_80);
  ((this->impl_)._M_t.super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>.
   _M_t.super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>.
   super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl)->dir = (DIR *)pDVar2;
  std::__cxx11::string::_M_assign
            ((string *)
             (this->impl_)._M_t.
             super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>._M_t.
             super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>.
             super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl);
  if (((this->impl_)._M_t.
       super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>._M_t.
       super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>.
       super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl)->dir != (DIR *)0x0) {
    next(this);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  pcVar3 = local_70;
  if (local_80 != pcVar3) {
    operator_delete(local_80);
    pcVar3 = extraout_RAX;
  }
  return (int)pcVar3;
}

Assistant:

void glob::open(const std::string &pattern) {
    auto dir_and_file = split_path(pattern);
    impl_->dir = opendir(dir_and_file.first.c_str());
    impl_->file_pattern = dir_and_file.second;

    if (impl_->dir != nullptr) {
        next();
    }
}